

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpTool.hpp
# Opt level: O0

void __thiscall
helptool::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *this,string *content,
          string *unit)

{
  rep rVar1;
  string *unit_local;
  string *content_local;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *this_local;
  
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->m_t_).__d.__r = rVar1;
  std::__cxx11::string::string((string *)&this->m_unit_,(string *)unit);
  std::__cxx11::string::string((string *)&this->content_,(string *)content);
  this->times_ = 1;
  return;
}

Assistant:

Timer(const std::string& content = "program",
        const std::string& unit="micro seconds"):
        m_t_(std::chrono::high_resolution_clock::now()),
        content_(content),
        m_unit_(unit),
        times_(1)   // 次数默认为1
    {

    }